

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::MetaTransaction::MetaTransaction
          (MetaTransaction *this,ClientContext *context_p,timestamp_t start_timestamp_p,
          transaction_t transaction_id_p)

{
  this->context = context_p;
  (this->start_timestamp).value = start_timestamp_p.value;
  this->global_transaction_id = transaction_id_p;
  ValidChecker::ValidChecker(&this->transaction_validity);
  (this->active_query).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->transactions)._M_h._M_buckets = &(this->transactions)._M_h._M_single_bucket;
  (this->transactions)._M_h._M_bucket_count = 1;
  (this->transactions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->transactions)._M_h._M_element_count = 0;
  (this->transactions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->transactions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->transactions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->all_transactions).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->all_transactions).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_transactions).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modified_database).ptr = (AttachedDatabase *)0x0;
  this->is_read_only = false;
  return;
}

Assistant:

MetaTransaction::MetaTransaction(ClientContext &context_p, timestamp_t start_timestamp_p,
                                 transaction_t transaction_id_p)
    : context(context_p), start_timestamp(start_timestamp_p), global_transaction_id(transaction_id_p),
      active_query(MAXIMUM_QUERY_ID), modified_database(nullptr), is_read_only(false) {
}